

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O3

int __thiscall mp::Error::init(Error *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  size_t in_RCX;
  void *in_RDX;
  string local_270;
  BasicWriter<char> local_250;
  Buffer<char> local_240;
  char local_220 [504];
  
  local_250.buffer_ = &local_240;
  local_250._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_002ee180;
  local_240.size_ = 0;
  local_240.capacity_ = 500;
  local_240._vptr_Buffer = (_func_int **)&PTR_grow_002ee1c8;
  local_240.ptr_ = local_220;
  fmt::BasicWriter<char>::write(&local_250,(int)ctx,in_RDX,in_RCX);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_270,(local_250.buffer_)->ptr_,
             (local_250.buffer_)->ptr_ + (local_250.buffer_)->size_);
  local_250._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_002ee180;
  local_240._vptr_Buffer = (_func_int **)&PTR_grow_002ee1c8;
  if (local_240.ptr_ != local_220) {
    operator_delete(local_240.ptr_,local_240.capacity_);
  }
  SetMessage(this,&local_270);
  iVar1 = extraout_EAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void init(fmt::CStringRef format_str, fmt::ArgList args) {
    SetMessage(fmt::format(format_str, args));
  }